

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

unsigned_short __thiscall
btAxisSweep3Internal<unsigned_short>::addHandle
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          void *pOwner,short collisionFilterGroup,short collisionFilterMask,btDispatcher *dispatcher
          ,void *multiSapProxy)

{
  uint uVar1;
  short *psVar2;
  ushort uVar3;
  Handle *pHVar4;
  long lVar5;
  ushort uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  unsigned_short local_3c [6];
  
  lVar10 = 0;
  quantize(this,local_3c + 3,aabbMin,0);
  quantize(this,local_3c,aabbMax,1);
  uVar3 = this->m_firstFreeHandle;
  pHVar4 = this->m_pHandles;
  uVar7 = (ulong)((uint)uVar3 * 0x50);
  this->m_firstFreeHandle =
       *(unsigned_short *)((long)(&(pHVar4->super_btBroadphaseProxy).m_aabbMax + 1) + uVar7);
  iVar8 = *(int *)&this->m_numHandles;
  this->m_numHandles = (short)iVar8 + 1;
  *(uint *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats + (uVar7 - 4)) = (uint)uVar3;
  *(void **)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats + (uVar7 - 0x1c)) = pOwner;
  *(short *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats + (uVar7 - 0x14)) =
       collisionFilterGroup;
  *(short *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats + (uVar7 - 0x12)) =
       collisionFilterMask;
  *(void **)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats + (uVar7 - 0xc)) =
       multiSapProxy;
  uVar1 = iVar8 * 2 + 2;
  uVar6 = (ushort)uVar1;
  iVar8 = (uVar1 & 0xffff) - 1;
  lVar9 = (long)iVar8;
  do {
    psVar2 = (short *)((long)this->m_pHandles->m_maxEdges + lVar10);
    *psVar2 = *psVar2 + 2;
    lVar5 = *(long *)((long)this->m_pEdges + lVar10 * 4);
    *(undefined4 *)(lVar5 + (ulong)((uVar1 & 0xffff) + 1) * 4) = *(undefined4 *)(lVar5 + lVar9 * 4);
    lVar5 = *(long *)((long)this->m_pEdges + lVar10 * 4);
    *(undefined2 *)(lVar5 + lVar9 * 4) = *(undefined2 *)((long)local_3c + lVar10 + 6);
    *(ushort *)(lVar5 + 2 + lVar9 * 4) = uVar3;
    *(undefined2 *)(lVar5 + (ulong)uVar6 * 4) = *(undefined2 *)((long)local_3c + lVar10);
    *(ushort *)(lVar5 + 2 + (ulong)uVar6 * 4) = uVar3;
    *(short *)((long)(&(pHVar4->super_btBroadphaseProxy).m_aabbMax + 1) + lVar10 + uVar7) =
         (short)iVar8;
    *(ushort *)((long)pHVar4->m_maxEdges + lVar10 + uVar7) = uVar6;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  sortMinDown(this,0,*(unsigned_short *)
                      ((long)(&(pHVar4->super_btBroadphaseProxy).m_aabbMax + 1) + uVar7),dispatcher,
              false);
  sortMaxDown(this,0,*(unsigned_short *)((long)pHVar4->m_maxEdges + uVar7),dispatcher,false);
  sortMinDown(this,1,*(unsigned_short *)
                      ((long)(&(pHVar4->super_btBroadphaseProxy).m_aabbMax + 1) + uVar7 + 2),
              dispatcher,false);
  sortMaxDown(this,1,*(unsigned_short *)((long)pHVar4->m_maxEdges + uVar7 + 2),dispatcher,false);
  sortMinDown(this,2,*(unsigned_short *)((long)pHVar4->m_maxEdges + (uVar7 - 2)),dispatcher,true);
  sortMaxDown(this,2,*(unsigned_short *)((long)pHVar4->m_maxEdges + uVar7 + 4),dispatcher,true);
  return uVar3;
}

Assistant:

BP_FP_INT_TYPE btAxisSweep3Internal<BP_FP_INT_TYPE>::addHandle(const btVector3& aabbMin,const btVector3& aabbMax, void* pOwner,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
	// quantize the bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// allocate a handle
	BP_FP_INT_TYPE handle = allocHandle();
	

	Handle* pHandle = getHandle(handle);
	
	pHandle->m_uniqueId = static_cast<int>(handle);
	//pHandle->m_pOverlaps = 0;
	pHandle->m_clientObject = pOwner;
	pHandle->m_collisionFilterGroup = collisionFilterGroup;
	pHandle->m_collisionFilterMask = collisionFilterMask;
	pHandle->m_multiSapParentProxy = multiSapProxy;

	// compute current limit of edge arrays
	BP_FP_INT_TYPE limit = static_cast<BP_FP_INT_TYPE>(m_numHandles * 2);

	
	// insert new edges just inside the max boundary edge
	for (BP_FP_INT_TYPE axis = 0; axis < 3; axis++)
	{

		m_pHandles[0].m_maxEdges[axis] += 2;

		m_pEdges[axis][limit + 1] = m_pEdges[axis][limit - 1];

		m_pEdges[axis][limit - 1].m_pos = min[axis];
		m_pEdges[axis][limit - 1].m_handle = handle;

		m_pEdges[axis][limit].m_pos = max[axis];
		m_pEdges[axis][limit].m_handle = handle;

		pHandle->m_minEdges[axis] = static_cast<BP_FP_INT_TYPE>(limit - 1);
		pHandle->m_maxEdges[axis] = limit;
	}

	// now sort the new edges to their correct position
	sortMinDown(0, pHandle->m_minEdges[0], dispatcher,false);
	sortMaxDown(0, pHandle->m_maxEdges[0], dispatcher,false);
	sortMinDown(1, pHandle->m_minEdges[1], dispatcher,false);
	sortMaxDown(1, pHandle->m_maxEdges[1], dispatcher,false);
	sortMinDown(2, pHandle->m_minEdges[2], dispatcher,true);
	sortMaxDown(2, pHandle->m_maxEdges[2], dispatcher,true);


	return handle;
}